

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test
::TestBody(PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  AssertHelper local_290;
  Message local_288;
  double local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_4;
  Message local_260;
  Type local_258 [2];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  Type local_230 [2];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  Message local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_1;
  Message local_1d0;
  Type local_1c8 [2];
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  PriceField price_field_price;
  ByteBuffer local_1a0 [8];
  PriceField price_field_unknown;
  ByteBuffer local_190 [8];
  PriceField price_field_string;
  allocator<char> local_179;
  string local_178 [32];
  FieldDef local_158 [8];
  FieldDef field_def_price;
  allocator<char> local_121;
  string local_120 [32];
  FieldDef local_100 [8];
  FieldDef field_def_unknown;
  allocator<char> local_c9;
  string local_c8 [32];
  FieldDef local_a8 [8];
  FieldDef field_def_string;
  string local_78 [32];
  double local_58;
  double price;
  uchar *unknown;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string string;
  PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test *this_local;
  
  string.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"ciao",&local_31);
  std::allocator<char>::~allocator(&local_31);
  price = (double)operator_new__(9);
  *(undefined1 *)price = 1;
  *(undefined1 *)((long)price + 1) = 2;
  *(undefined1 *)((long)price + 2) = 3;
  *(undefined1 *)((long)price + 3) = 4;
  *(undefined1 *)((long)price + 4) = 5;
  *(undefined1 *)((long)price + 5) = 6;
  *(undefined1 *)((long)price + 6) = 7;
  *(undefined1 *)((long)price + 7) = 8;
  *(undefined1 *)((long)price + 8) = 9;
  local_58 = 9876.543;
  std::__cxx11::string::string(local_78,(string *)local_30);
  bidfx_public_api::tools::Varint::WriteString
            (&(this->super_PriceUpdateDecoderTest).field_0x18,local_78);
  std::__cxx11::string::~string(local_78);
  bidfx_public_api::tools::Varint::WriteU32
            ((OutputStream *)&(this->super_PriceUpdateDecoderTest).field_0x18,9);
  bidfx_public_api::tools::ByteBuffer::WriteBytes
            ((uchar *)&(this->super_PriceUpdateDecoderTest).buffer,(ulong)price);
  uVar3 = (ulong)(local_58 * 1000000.0);
  bidfx_public_api::tools::Varint::WriteU64
            ((OutputStream *)&(this->super_PriceUpdateDecoderTest).field_0x18,
             uVar3 | (long)(local_58 * 1000000.0 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"field",&local_c9);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_a8,1,0x53,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"field",&local_121);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_100,1,0x20,local_120,0x42,0);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"field",&local_179);
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_158,1,0x44,local_178,0x56,6);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            (local_190,(FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            (local_1a0,(FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField
            ((ByteBuffer *)&gtest_ar.message_,
             (FieldDef *)&(this->super_PriceUpdateDecoderTest).buffer);
  local_1c8[1] = 3;
  local_1c8[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_1c0,"PriceField::STRING","price_field_string.GetType()",
             local_1c8 + 1,local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1e8,"string","price_field_string.GetString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_208);
  std::__cxx11::string::~string((string *)&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_230[1] = 4;
  local_230[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_228,"PriceField::NOTHING","price_field_unknown.GetType()",
             local_230 + 1,local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_258[1] = 2;
  local_258[0] = bidfx_public_api::price::PriceField::GetType();
  testing::internal::EqHelper<false>::
  Compare<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((EqHelper<false> *)local_250,"PriceField::DOUBLE","price_field_price.GetType()",
             local_258 + 1,local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_280 = (double)bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_278,"price","price_field_price.GetDouble()",&local_58,
             &local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)&gtest_ar.message_);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)local_1a0);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)local_190);
  FieldDef::~FieldDef(local_158);
  FieldDef::~FieldDef(local_100);
  FieldDef::~FieldDef(local_a8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_skip_bytes_in_case_type_is_unknown)
{
    std::string string = "ciao";
    unsigned char* unknown = new unsigned char[9]{1, 2, 3, 4, 5, 6, 7, 8, 9};
    double price = 9876.543;

    // STRING
    Varint::WriteString(buffer, string);
    // UNDECODABLE
    Varint::WriteU32(buffer, 9);
    buffer.WriteBytes(unknown, 9);
    // PRICE
    Varint::WriteU64(buffer, (uint64_t)(price * 1000000));

    FieldDef field_def_string = FieldDef(1, FieldTypeEnum::STRING, "field");
    FieldDef field_def_unknown = FieldDef(1, FieldTypeEnum::UNRECOGNISED, "field", FieldEncodingEnum::BYTE_ARRAY, 0);
    FieldDef field_def_price = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field_string = PriceUpdateDecoder::DecodeField(buffer, field_def_string);
    PriceField price_field_unknown = PriceUpdateDecoder::DecodeField(buffer, field_def_unknown);
    PriceField price_field_price = PriceUpdateDecoder::DecodeField(buffer, field_def_price);

    EXPECT_EQ(PriceField::STRING, price_field_string.GetType());
    EXPECT_EQ(string, price_field_string.GetString());
    EXPECT_EQ(PriceField::NOTHING, price_field_unknown.GetType());
    EXPECT_EQ(PriceField::DOUBLE, price_field_price.GetType());
    EXPECT_EQ(price, price_field_price.GetDouble());
}